

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_decompress.c
# Opt level: O0

libdeflate_decompressor * libdeflate_alloc_decompressor_ex(libdeflate_options *options)

{
  long *in_RDI;
  libdeflate_decompressor *d;
  free_func_t local_28;
  malloc_func_t local_20;
  libdeflate_decompressor *local_8;
  
  if (*in_RDI == 0x18) {
    if (in_RDI[1] == 0) {
      local_20 = libdeflate_default_malloc_func;
    }
    else {
      local_20 = (malloc_func_t)in_RDI[1];
    }
    local_8 = (libdeflate_decompressor *)(*local_20)(0x2d30);
    if (local_8 == (libdeflate_decompressor *)0x0) {
      local_8 = (libdeflate_decompressor *)0x0;
    }
    else {
      memset(local_8,0,0x2d30);
      if (in_RDI[2] == 0) {
        local_28 = libdeflate_default_free_func;
      }
      else {
        local_28 = (free_func_t)in_RDI[2];
      }
      local_8->free_func = local_28;
    }
  }
  else {
    local_8 = (libdeflate_decompressor *)0x0;
  }
  return local_8;
}

Assistant:

libdeflate_decompressor *
libdeflate_alloc_decompressor_ex(const struct libdeflate_options *options)
{
	struct libdeflate_decompressor *d;

	/*
	 * Note: if more fields are added to libdeflate_options, this code will
	 * need to be updated to support both the old and new structs.
	 */
	if (options->sizeof_options != sizeof(*options))
		return NULL;

	d = (options->malloc_func ? options->malloc_func :
	     libdeflate_default_malloc_func)(sizeof(*d));
	if (d == NULL)
		return NULL;
	/*
	 * Note that only certain parts of the decompressor actually must be
	 * initialized here:
	 *
	 * - 'static_codes_loaded' must be initialized to false.
	 *
	 * - The first half of the main portion of each decode table must be
	 *   initialized to any value, to avoid reading from uninitialized
	 *   memory during table expansion in build_decode_table().  (Although,
	 *   this is really just to avoid warnings with dynamic tools like
	 *   valgrind, since build_decode_table() is guaranteed to initialize
	 *   all entries eventually anyway.)
	 *
	 * - 'free_func' must be set.
	 *
	 * But for simplicity, we currently just zero the whole decompressor.
	 */
	memset(d, 0, sizeof(*d));
	d->free_func = options->free_func ?
		       options->free_func : libdeflate_default_free_func;
	return d;
}